

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cpp
# Opt level: O1

void __thiscall
polyscope::Histogram::smoothCurve
          (Histogram *this,
          vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *xVals,
          vector<double,_std::allocator<double>_> *yVals)

{
  undefined1 auVar1 [16];
  pointer paVar2;
  pointer pdVar3;
  double dVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  double dVar8;
  undefined1 auVar9 [64];
  undefined1 auVar10 [16];
  vector<double,_std::allocator<double>_> smoothedVals;
  allocator_type local_51;
  double local_50;
  double local_48;
  vector<double,_std::allocator<double>_> local_40;
  undefined1 extraout_var [56];
  
  std::vector<double,_std::allocator<double>_>::vector
            (&local_40,
             (long)(yVals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(yVals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3,&local_51);
  if ((yVals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish !=
      (yVals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar7 = 0;
    do {
      paVar2 = (xVals->
               super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((yVals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_finish ==
          (yVals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_start) {
        dVar8 = 0.0;
      }
      else {
        dVar8 = 0.0;
        lVar5 = 8;
        uVar6 = 0;
        local_48 = (paVar2[uVar7]._M_elems[0] + paVar2[uVar7]._M_elems[1]) * 0.5;
        do {
          paVar2 = (xVals->
                   super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          dVar4 = local_48 +
                  (*(double *)((long)paVar2->_M_elems + lVar5 + -8) +
                  *(double *)((long)paVar2->_M_elems + lVar5)) * -0.5;
          local_50 = dVar8;
          auVar9._0_8_ = exp(dVar4 * dVar4 * -1000.0);
          auVar9._8_56_ = extraout_var;
          pdVar3 = (yVals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          auVar10._8_8_ = 0;
          auVar10._0_8_ = local_50;
          auVar1._8_8_ = 0;
          auVar1._0_8_ = pdVar3[uVar6];
          auVar1 = vfmadd231sd_fma(auVar10,auVar9._0_16_,auVar1);
          dVar8 = auVar1._0_8_;
          uVar6 = uVar6 + 1;
          lVar5 = lVar5 + 0x10;
          local_50 = dVar8;
        } while (uVar6 < (ulong)((long)(yVals->super__Vector_base<double,_std::allocator<double>_>).
                                       _M_impl.super__Vector_impl_data._M_finish - (long)pdVar3 >> 3
                                ));
      }
      local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar7] = dVar8;
      uVar7 = uVar7 + 1;
    } while (uVar7 < (ulong)((long)(yVals->super__Vector_base<double,_std::allocator<double>_>).
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)(yVals->super__Vector_base<double,_std::allocator<double>_>).
                                   _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  std::vector<double,_std::allocator<double>_>::operator=(yVals,&local_40);
  if (local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Histogram::smoothCurve(std::vector<std::array<double, 2>>& xVals, std::vector<double>& yVals) {

  auto smoothFunc = [&](double x1, double x2) {
    // Tent
    // double radius = 0.1;
    // double val = (radius - std::abs(x1 - x2)) / radius;
    // return std::max(val, 0.0);

    // Gaussian
    double widthFactor = 1000;
    double dist = (x1 - x2);
    return std::exp(-dist * dist * widthFactor);

    // None
    // if(x1 == x2) return 1.0;
    // return 0.0;
  };

  std::vector<double> smoothedVals(yVals.size());
  for (size_t i = 0; i < yVals.size(); i++) {
    double bucketCi = 0.5 * (xVals[i][0] + xVals[i][1]);
    double sum = 0.0;
    for (size_t j = 0; j < yVals.size(); j++) {
      double bucketCj = 0.5 * (xVals[j][0] + xVals[j][1]);
      double weight = smoothFunc(bucketCi, bucketCj);
      sum += weight * yVals[j];
    }
    smoothedVals[i] = sum;
  }

  yVals = smoothedVals;
}